

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O2

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product
          (vloc_synchronized_edges_iterator_t *this)

{
  loc_edges_maps_t *plVar1;
  pointer psVar2;
  bool bVar3;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *pmVar4;
  uint *puVar5;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __end2;
  synchronization_t *psVar6;
  sync_constraint_t *constr;
  pointer psVar7;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  edges;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  local_40;
  
  cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
  ::clear(&this->_cartesian_it);
  psVar6 = (this->_sync_it)._M_current;
LAB_001a2423:
  if (psVar6 == (this->_sync_end)._M_current) {
    return;
  }
  pmVar4 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
           intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
           ::operator*(&this->_vloc);
  plVar1 = (this->_loc_edges_maps).
           super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar7 = (psVar6->_constraints).
           super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (psVar6->_constraints).
           super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar7 == psVar2) {
      psVar6 = (this->_sync_it)._M_current;
      if (psVar6 == (this->_sync_end)._M_current) {
        return;
      }
      psVar2 = (psVar6->_constraints).
               super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar7 = (psVar6->_constraints).
                    super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1
          ) {
        plVar1 = (this->_loc_edges_maps).
                 super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pmVar4 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
                 intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                 ::operator*(&this->_vloc);
        puVar5 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                           (pmVar4,psVar7->_pid);
        local_40 = tchecker::system::loc_edges_maps_t::edges(plVar1,*puVar5,psVar7->_event_id);
        if ((psVar7->_strength != SYNC_WEAK) ||
           ((shared_ptr<tchecker::system::edge_t> *)local_40._begin.super_const_iterator._M_current
            != local_40._end.super_const_iterator._M_current.super_const_iterator)) {
          cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
          ::push_back(&this->_cartesian_it,&local_40);
        }
      }
      return;
    }
    if (psVar7->_strength == SYNC_STRONG) {
      puVar5 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                         (pmVar4,psVar7->_pid);
      bVar3 = tchecker::system::loc_edges_maps_t::event(plVar1,*puVar5,psVar7->_event_id);
      if (!bVar3) break;
    }
    psVar7 = psVar7 + 1;
  } while( true );
  psVar6 = (this->_sync_it)._M_current + 1;
  (this->_sync_it)._M_current = psVar6;
  goto LAB_001a2423;
}

Assistant:

void tchecker::syncprod::vloc_synchronized_edges_iterator_t::advance_while_empty_cartesian_product()
{
  _cartesian_it.clear();

  while (!at_end()) {
    if (tchecker::syncprod::enabled(*_sync_it, *_vloc, *_loc_edges_maps))
      break;
    ++_sync_it;
  }

  if (at_end())
    return;

  auto constraints = _sync_it->synchronization_constraints();
  for (auto const & constr : constraints) {
    auto edges = _loc_edges_maps->edges((*_vloc)[constr.pid()], constr.event_id());
    if ((constr.strength() == tchecker::SYNC_WEAK) && (edges.begin() == edges.end()))
      continue;
    _cartesian_it.push_back(edges);
  }
}